

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

idx_t duckdb::BinaryExecutor::Select<unsigned_short,unsigned_short,duckdb::GreaterThan>
                (Vector *left,Vector *right,SelectionVector *sel,idx_t count,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  VectorType VVar1;
  idx_t iVar2;
  long in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  Vector *in_stack_00000030;
  Vector *in_stack_00000038;
  Vector *in_stack_00000040;
  SelectionVector *in_stack_00000098;
  SelectionVector *in_stack_000000a0;
  idx_t in_stack_000000a8;
  SelectionVector *in_stack_000000b0;
  Vector *in_stack_000000b8;
  Vector *in_stack_000000c0;
  
  if (in_RDX == 0) {
    FlatVector::IncrementalSelectionVector();
  }
  VVar1 = Vector::GetVectorType(in_RDI);
  if ((VVar1 == CONSTANT_VECTOR) &&
     (VVar1 = Vector::GetVectorType(in_RSI), VVar1 == CONSTANT_VECTOR)) {
    iVar2 = SelectConstant<unsigned_short,unsigned_short,duckdb::GreaterThan>
                      (left,right,sel,count,true_sel,false_sel);
    return iVar2;
  }
  VVar1 = Vector::GetVectorType(in_RDI);
  if ((VVar1 == CONSTANT_VECTOR) && (VVar1 = Vector::GetVectorType(in_RSI), VVar1 == FLAT_VECTOR)) {
    iVar2 = SelectFlat<unsigned_short,unsigned_short,duckdb::GreaterThan,true,false>
                      (in_stack_00000038,in_stack_00000030,(SelectionVector *)left,(idx_t)right,sel,
                       (SelectionVector *)count);
    return iVar2;
  }
  VVar1 = Vector::GetVectorType(in_RDI);
  if ((VVar1 == FLAT_VECTOR) && (VVar1 = Vector::GetVectorType(in_RSI), VVar1 == CONSTANT_VECTOR)) {
    iVar2 = SelectFlat<unsigned_short,unsigned_short,duckdb::GreaterThan,false,true>
                      (in_stack_00000038,in_stack_00000030,(SelectionVector *)left,(idx_t)right,sel,
                       (SelectionVector *)count);
    return iVar2;
  }
  VVar1 = Vector::GetVectorType(in_RDI);
  if ((VVar1 == FLAT_VECTOR) && (VVar1 = Vector::GetVectorType(in_RSI), VVar1 == FLAT_VECTOR)) {
    iVar2 = SelectFlat<unsigned_short,unsigned_short,duckdb::GreaterThan,false,false>
                      (in_stack_00000040,in_stack_00000038,(SelectionVector *)in_stack_00000030,
                       (idx_t)left,(SelectionVector *)right,sel);
    return iVar2;
  }
  iVar2 = SelectGeneric<unsigned_short,unsigned_short,duckdb::GreaterThan>
                    (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
                     in_stack_000000a0,in_stack_00000098);
  return iVar2;
}

Assistant:

static idx_t Select(Vector &left, Vector &right, const SelectionVector *sel, idx_t count, SelectionVector *true_sel,
	                    SelectionVector *false_sel) {
		if (!sel) {
			sel = FlatVector::IncrementalSelectionVector();
		}
		if (left.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    right.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			return SelectConstant<LEFT_TYPE, RIGHT_TYPE, OP>(left, right, sel, count, true_sel, false_sel);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (left.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		           right.GetVectorType() == VectorType::FLAT_VECTOR) {
			return SelectFlat<LEFT_TYPE, RIGHT_TYPE, OP, true, false>(left, right, sel, count, true_sel, false_sel);
		} else if (left.GetVectorType() == VectorType::FLAT_VECTOR &&
		           right.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			return SelectFlat<LEFT_TYPE, RIGHT_TYPE, OP, false, true>(left, right, sel, count, true_sel, false_sel);
		} else if (left.GetVectorType() == VectorType::FLAT_VECTOR &&
		           right.GetVectorType() == VectorType::FLAT_VECTOR) {
			return SelectFlat<LEFT_TYPE, RIGHT_TYPE, OP, false, false>(left, right, sel, count, true_sel, false_sel);
#endif
		} else {
			return SelectGeneric<LEFT_TYPE, RIGHT_TYPE, OP>(left, right, sel, count, true_sel, false_sel);
		}
	}